

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

void Ivy_FastMapRequired(Ivy_Man_t *pAig,int Delay,int fSetInter)

{
  short sVar1;
  Vec_Vec_t *p;
  int *piVar2;
  void *pvVar3;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pIVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  int i;
  char *pcVar8;
  int iVar9;
  long lVar10;
  
  for (iVar9 = 0; iVar9 < pAig->vPis->nSize; iVar9 = iVar9 + 1) {
    piVar2 = (int *)Vec_PtrEntry(pAig->vPis,iVar9);
    lVar10 = *(long *)((long)pAig->pData + 0x10);
    lVar5 = (long)*(int *)((long)pAig->pData + 8) * (long)*piVar2;
    *(undefined2 *)(lVar10 + 10 + lVar5) = 10000;
    *(undefined4 *)(lVar10 + 4 + lVar5) = 0;
  }
  for (iVar9 = 0; iVar9 < pAig->vObjs->nSize; iVar9 = iVar9 + 1) {
    piVar2 = (int *)Vec_PtrEntry(pAig->vObjs,iVar9);
    if ((piVar2 != (int *)0x0) && (0xfffffffd < (piVar2[2] & 0xfU) - 7)) {
      lVar10 = *(long *)((long)pAig->pData + 0x10);
      lVar5 = (long)*(int *)((long)pAig->pData + 8) * (long)*piVar2;
      *(undefined2 *)(lVar10 + 10 + lVar5) = 10000;
      *(undefined4 *)(lVar10 + 4 + lVar5) = 0;
    }
  }
  iVar9 = 0;
  while( true ) {
    if (pAig->vPos->nSize <= iVar9) break;
    pvVar3 = Vec_PtrEntry(pAig->vPos,iVar9);
    lVar10 = *(long *)((long)pAig->pData + 0x10);
    lVar5 = (long)*(int *)((long)pAig->pData + 8) *
            (long)*(int *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe);
    *(short *)(lVar10 + 10 + lVar5) = (short)Delay;
    piVar2 = (int *)(lVar10 + 4 + lVar5);
    *piVar2 = *piVar2 + 1;
    iVar9 = iVar9 + 1;
  }
  p = *(Vec_Vec_t **)((long)pAig->pData + 0x18);
  iVar9 = p->nSize;
  do {
    if (iVar9 < 1) {
      return;
    }
    iVar9 = iVar9 + -1;
    p_00 = Vec_VecEntry(p,iVar9);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      piVar2 = (int *)Vec_PtrEntry(p_00,i);
      lVar10 = *(long *)((long)pAig->pData + 0x10);
      lVar5 = (long)*(int *)((long)pAig->pData + 8) * (long)*piVar2;
      if (*(int *)(lVar10 + 4 + lVar5) < 1) {
        __assert_fail("pSupp->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                      ,0x366,"void Ivy_FastMapRequired(Ivy_Man_t *, int, int)");
      }
      pcVar8 = (char *)(lVar10 + lVar5);
      for (lVar10 = 0; lVar10 < *pcVar8; lVar10 = lVar10 + 1) {
        pIVar4 = Ivy_ManObj(pAig,*(int *)(pcVar8 + lVar10 * 4 + 0xc));
        lVar5 = *(long *)((long)pAig->pData + 0x10);
        lVar6 = (long)*(int *)((long)pAig->pData + 8) * (long)pIVar4->Id;
        sVar1 = *(short *)(lVar5 + 10 + lVar6);
        sVar7 = (short)(*(short *)(pcVar8 + 10) + -1);
        if ((int)sVar1 < *(short *)(pcVar8 + 10) + -1) {
          sVar7 = sVar1;
        }
        *(short *)(lVar5 + 10 + lVar6) = sVar7;
        piVar2 = (int *)(lVar5 + 4 + lVar6);
        *piVar2 = *piVar2 + 1;
      }
    }
  } while( true );
}

Assistant:

void Ivy_FastMapRequired( Ivy_Man_t * pAig, int Delay, int fSetInter )
{
    Vec_Vec_t * vLuts;
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    Ivy_Supp_t * pSupp, * pSuppF;
    int i, k, c;
    // clean the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    Ivy_ManForEachNode( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    // set the required times of the POs
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, Ivy_ObjFanin0(pObj) );
        pSupp->DelayR = Delay;
        pSupp->nRefs++;
    }
    // get the levelized nodes used in the mapping
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    // propagate the required times
    Vec_VecForEachLevelReverse( vLuts, vNodes, i )
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        assert( pSupp->nRefs > 0 );
        for ( c = 0; c < pSupp->nSize; c++ )
        {
            pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
            pSuppF->DelayR = IVY_MIN( pSuppF->DelayR, pSupp->DelayR - 1 );
            pSuppF->nRefs++;
        }
    }
/*
    // print out some of the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        printf( "%d ", pSupp->DelayR );
    }
    printf( "\n" );    
*/

    if ( fSetInter )
    {
        // set the required times of the intermediate nodes
        Vec_VecForEachLevelReverse( vLuts, vNodes, i )
        Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            Ivy_FastMapRequired_rec( pAig, pObj, pObj, pSupp->DelayR ); 
        }
        // make sure that all required times are assigned
        Ivy_ManForEachNode( pAig, pObj, i )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            assert( pSupp->DelayR < IVY_INFINITY );
        }
    }
}